

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O2

int __thiscall Nova::Parse_Args::Find_Match(Parse_Args *this,string *str,Type *type)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  
  uVar1 = Find_Match(this,str);
  if ((int)uVar1 < 0) {
    poVar2 = std::operator<<(Log::(anonymous_namespace)::cout,"Argument ");
    poVar2 = std::operator<<(poVar2,(string *)str);
    pcVar3 = " undeclared";
  }
  else {
    if ((this->arg_data_list).super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar1].type == *type) {
      return uVar1;
    }
    poVar2 = std::operator<<(Log::(anonymous_namespace)::cout,"Type mismatch in Find_Match(");
    poVar2 = std::operator<<(poVar2,(string *)str);
    pcVar3 = ")";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-1);
}

Assistant:

int Parse_Args::
Find_Match(const std::string& str,const Arg_Data::Type& type) const
{
    int match=Find_Match(str);
    if(match<0)
    {
        Log::cout<<"Argument "<<str<<" undeclared"<<std::endl;
        exit(-1);
    }

    if(arg_data_list[match].type!=type)
    {
        Log::cout<<"Type mismatch in Find_Match("<<str<<")"<<std::endl;
        exit(-1);
    }
    return match;
}